

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

uint8_t get_epoch(uint8_t first_byte)

{
  byte in_DIL;
  uint8_t local_1;
  
  if ((in_DIL & 0x80) == 0) {
    local_1 = '\x03';
  }
  else if ((in_DIL & 0xf0) == 0xc0) {
    local_1 = '\0';
  }
  else if ((in_DIL & 0xf0) == 0xd0) {
    local_1 = '\x01';
  }
  else {
    if ((in_DIL & 0xf0) != 0xe0) {
      __assert_fail("!\"FIXME\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x224,"uint8_t get_epoch(uint8_t)");
    }
    local_1 = '\x02';
  }
  return local_1;
}

Assistant:

static inline uint8_t get_epoch(uint8_t first_byte)
{
    if (!QUICLY_PACKET_IS_LONG_HEADER(first_byte))
        return QUICLY_EPOCH_1RTT;

    switch (first_byte & QUICLY_PACKET_TYPE_BITMASK) {
    case QUICLY_PACKET_TYPE_INITIAL:
        return QUICLY_EPOCH_INITIAL;
    case QUICLY_PACKET_TYPE_HANDSHAKE:
        return QUICLY_EPOCH_HANDSHAKE;
    case QUICLY_PACKET_TYPE_0RTT:
        return QUICLY_EPOCH_0RTT;
    default:
        assert(!"FIXME");
    }
}